

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O1

Face * __thiscall HalfMesh::Mesh::get_face(Mesh *this,uint i)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type *ppFVar3;
  mapped_type pFVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint local_c;
  
  uVar1 = (this->face_handle_to_face_map)._M_h._M_bucket_count;
  uVar5 = (ulong)i % uVar1;
  p_Var6 = (this->face_handle_to_face_map)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint *)&p_Var6->_M_nxt[1]._M_nxt != i)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var2[1]._M_nxt == i)) goto LAB_001113d0;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001113d0:
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    pFVar4 = (Face *)0x0;
  }
  else {
    local_c = i;
    ppFVar3 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_HalfMesh::Face_*>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_HalfMesh::Face_*>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->face_handle_to_face_map,&local_c);
    pFVar4 = *ppFVar3;
  }
  return pFVar4;
}

Assistant:

Face *get_face(unsigned int i) {
            Face *new_face = NULL_FACE;
            if (face_handle_to_face_map.find(i) != face_handle_to_face_map.end()) {
                return face_handle_to_face_map[i];
            } else {
                return new_face;
            }
        }